

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kosinski-decompress.c
# Opt level: O1

void KosinskiDecompress(KosinskiDecompressCallbacks *callbacks,cc_bool print_debug_information)

{
  uchar uVar1;
  bool bVar2;
  size_t sVar3;
  cc_bool cVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  char *pcVar9;
  long lVar10;
  ulong uVar11;
  
  write_position = 0;
  read_position = 1;
  uVar6 = (*callbacks->read_byte)(callbacks->read_byte_user_data);
  read_position = read_position + 1;
  uVar7 = (*callbacks->read_byte)(callbacks->read_byte_user_data);
  descriptor = uVar7 << 8 | uVar6;
  descriptor_bits_remaining = 0x10;
  do {
    while (cVar4 = PopDescriptor(callbacks), sVar3 = read_position, cVar4 != '\0') {
      read_position = read_position + 1;
      uVar6 = (*callbacks->read_byte)(callbacks->read_byte_user_data);
      if (print_debug_information != '\0') {
        fprintf(_stderr,"%lX - Literal match: At %lX, value %X\n",sVar3,write_position,
                (ulong)(byte)uVar6);
      }
      (*callbacks->write_byte)(callbacks->write_byte_user_data,(uint)uVar6 & 0xff);
      uVar7 = (uint)write_position;
      write_position = write_position + 1;
      backsearch_buffer[uVar7 & 0x1fff] = (byte)uVar6;
    }
    cVar4 = PopDescriptor(callbacks);
    sVar3 = read_position;
    if (cVar4 == '\0') {
      cVar4 = PopDescriptor(callbacks);
      bVar5 = PopDescriptor(callbacks);
      read_position = read_position + 1;
      uVar6 = (*callbacks->read_byte)(callbacks->read_byte_user_data);
      uVar6 = (uVar6 ^ 0xff) + 1;
      uVar11 = (ulong)bVar5 + (ulong)(cVar4 != '\0') * 2 + 2;
      if (print_debug_information != '\0') {
        KosinskiDecompress_cold_1();
      }
LAB_001015d4:
      iVar8 = 0;
      for (; uVar11 != 0; uVar11 = uVar11 - 1) {
        uVar1 = backsearch_buffer[(int)write_position - uVar6 & 0x1fff];
        (*callbacks->write_byte)(callbacks->write_byte_user_data,(uint)uVar1);
        uVar7 = (uint)write_position;
        write_position = write_position + 1;
        backsearch_buffer[uVar7 & 0x1fff] = uVar1;
      }
    }
    else {
      read_position = read_position + 1;
      uVar6 = (*callbacks->read_byte)(callbacks->read_byte_user_data);
      read_position = read_position + 1;
      uVar7 = (*callbacks->read_byte)(callbacks->read_byte_user_data);
      uVar6 = 0x2000 - (uVar6 & 0xff | (uVar7 & 0xf8) << 5);
      if ((uVar7 & 7) == 0) {
        read_position = read_position + 1;
        uVar7 = (*callbacks->read_byte)(callbacks->read_byte_user_data);
        if (uVar7 == 0) {
          iVar8 = 2;
          uVar11 = 1;
          if (print_debug_information == '\0') {
LAB_001015cd:
            bVar2 = false;
            goto LAB_001015cf;
          }
          pcVar9 = "%lX - Terminator: At %lX, src %lX\n";
        }
        else {
          uVar11 = (ulong)(uVar7 + 1);
          if (uVar7 + 1 != 2) {
            if (print_debug_information != '\0') {
              lVar10 = write_position - uVar6;
              pcVar9 = "%lX - Extended full match: At %lX, src %lX, len %lX\n";
              goto LAB_00101685;
            }
            goto LAB_001014c8;
          }
          iVar8 = 3;
          uVar11 = 2;
          if (print_debug_information == '\0') goto LAB_001015cd;
          pcVar9 = "%lX - 0xA000 boundary flag: At %lX, src %lX\n";
        }
        bVar2 = false;
        fprintf(_stderr,pcVar9,sVar3,write_position,write_position - uVar6);
      }
      else {
        uVar11 = (ulong)((uVar7 & 7) + 2);
        if (print_debug_information == '\0') {
LAB_001014c8:
          bVar2 = true;
          iVar8 = 0;
        }
        else {
          lVar10 = write_position - uVar6;
          pcVar9 = "%lX - Full match: At %lX, src %lX, len %lX\n";
LAB_00101685:
          iVar8 = 0;
          bVar2 = true;
          fprintf(_stderr,pcVar9,sVar3,write_position,lVar10,uVar11);
        }
      }
LAB_001015cf:
      if (bVar2) goto LAB_001015d4;
    }
    if (iVar8 == 2) {
      return;
    }
  } while( true );
}

Assistant:

void KosinskiDecompress(const KosinskiDecompressCallbacks* const callbacks, const cc_bool print_debug_information)
{
	read_position = 0;
	write_position = 0;

	GetDescriptor(callbacks);

	for (;;)
	{
		if (PopDescriptor(callbacks))
		{
			const size_t position = read_position;

			const unsigned char byte = ReadByte(callbacks);

			if (print_debug_information)
				fprintf(stderr, "%lX - Literal match: At %lX, value %X\n", (unsigned long)position, (unsigned long)write_position, byte);

			WriteByte(byte, callbacks);
		}
		else
		{
			unsigned int distance;
			size_t count;

			if (PopDescriptor(callbacks))
			{
				const size_t position = read_position;

				const unsigned char low_byte = ReadByte(callbacks);
				const unsigned char high_byte = ReadByte(callbacks);

				distance = ((high_byte & 0xF8) << 5) | low_byte;
				distance = (distance ^ 0x1FFF) + 1; /* Convert from negative two's-complement to positive */
				count = high_byte & 7;

				if (count != 0)
				{
					count += 2;

					if (print_debug_information)
						fprintf(stderr, "%lX - Full match: At %lX, src %lX, len %lX\n", (unsigned long)position, (unsigned long)write_position, (unsigned long)(write_position - distance), (unsigned long)count);
				}
				else
				{
					count = ReadByte(callbacks) + 1;

					if (count == 1)
					{
						if (print_debug_information)
							fprintf(stderr, "%lX - Terminator: At %lX, src %lX\n", (unsigned long)position, (unsigned long)write_position, (unsigned long)(write_position - distance));

						break;
					}
					else if (count == 2)
					{
						if (print_debug_information)
							fprintf(stderr, "%lX - 0xA000 boundary flag: At %lX, src %lX\n", (unsigned long)position, (unsigned long)write_position, (unsigned long)(write_position - distance));

						continue;
					}
					else
					{
						if (print_debug_information)
							fprintf(stderr, "%lX - Extended full match: At %lX, src %lX, len %lX\n", (unsigned long)position, (unsigned long)write_position, (unsigned long)(write_position - distance), (unsigned long)count);
					}
				}
			}
			else
			{
				count = 2;

				if (PopDescriptor(callbacks))
					count += 2;
				if (PopDescriptor(callbacks))
					count += 1;

				distance = (ReadByte(callbacks) ^ 0xFF) + 1; /* Convert from negative two's-complement to positive */

				if (print_debug_information)
					fprintf(stderr, "%lX - Inline match: At %lX, src %lX, len %lX\n", (unsigned long)(read_position - 1), (unsigned long)write_position, (unsigned long)(write_position - distance), (unsigned long)count);
			}

			while (count-- != 0)
				WriteByte(backsearch_buffer[(write_position - distance) % SLIDING_WINDOW_SIZE], callbacks);
		}
	}
}